

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsPresolveStatus __thiscall
Highs::runPresolve(Highs *this,bool force_lp_presolve,bool force_presolve)

{
  PresolveComponent *this_00;
  HighsSparseMatrix *this_01;
  HighsTimer *this_02;
  HighsModel *this_03;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  HighsPresolveStatus HVar8;
  size_t __n;
  double *pdVar9;
  pointer pHVar10;
  int iVar11;
  HighsPresolveStatus presolve_status;
  HighsInt HVar12;
  HighsInt HVar13;
  HighsLp *pHVar14;
  size_t in_RCX;
  double dVar15;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  char *format;
  Highs *this_04;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsMipSolver solver;
  undefined1 local_300 [144];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  pointer local_258;
  pointer local_240;
  undefined1 local_220 [360];
  HighsTimer local_b8;
  
  this_00 = &this->presolve_;
  PresolveComponent::clear(this_00);
  __n = (this->options_).super_HighsOptionsStruct.presolve._M_string_length;
  if (__n == ::kHighsOffString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      bVar17 = false;
    }
    else {
      iVar11 = bcmp((this->options_).super_HighsOptionsStruct.presolve._M_dataplus._M_p,
                    ::kHighsOffString_abi_cxx11_._M_dataplus._M_p,__n);
      bVar17 = iVar11 != 0;
    }
    if ((bVar17 | force_presolve) != 1) {
      return kNotPresolved;
    }
  }
  if ((this->model_).lp_.num_row_ == 0 && (this->model_).lp_.num_col_ == 0) {
    return kNotReduced;
  }
  this_01 = &(this->model_).lp_.a_matrix_;
  HighsSparseMatrix::ensureColwise(this_01);
  if ((this->model_).lp_.num_row_ == 0 && (this->model_).lp_.num_col_ == 0) {
    return kNullError;
  }
  this_02 = &this->timer_;
  pdVar9 = (this->timer_).clock_start.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __buf = extraout_RDX;
  if (0.0 < *pdVar9 || *pdVar9 == 0.0) {
    HighsTimer::start(this_02,0);
    __buf = extraout_RDX_00;
  }
  HighsTimer::read(this_02,0,__buf,in_RCX);
  dVar4 = (this->options_).super_HighsOptionsStruct.time_limit;
  dVar15 = ABS(dVar4);
  if ((uint)((ulong)((long)dVar15 + -0x10000000000000) >> 0x35) < 0x3ff && (long)dVar4 < 0 ||
      ((dVar15 == INFINITY || (dVar15 == 0.0 || 0x7fefffffffffffff < (ulong)dVar15)) ||
      (long)dVar15 - 1U < 0xfffffffffffff && (long)dVar4 < 0)) {
LAB_00207f10:
    this_03 = &this->model_;
    bVar17 = HighsLp::isMip(&this_03->lp_);
    if (bVar17 && !force_lp_presolve) {
      HighsMipSolver::HighsMipSolver
                ((HighsMipSolver *)local_220,&this->callback_,&this->options_,&this_03->lp_,
                 &this->solution_,false,0);
      HighsTimer::start(&local_b8,0);
      HighsMipSolver::runPresolve
                ((HighsMipSolver *)local_220,
                 (this->options_).super_HighsOptionsStruct.presolve_reduction_limit);
      presolve_status = HighsMipSolver::getPresolveStatus((HighsMipSolver *)local_220);
      pHVar14 = HighsMipSolver::getPresolvedModel((HighsMipSolver *)local_220);
      HighsLp::operator=(&(this->presolve_).data_.reduced_lp_,pHVar14);
      HighsMipSolver::getPostsolveStack
                ((HighsPostsolveStack *)local_300,(HighsMipSolver *)local_220);
      this_04 = (Highs *)local_300;
      ::presolve::HighsPostsolveStack::operator=
                (&(this->presolve_).data_.postSolveStack,(HighsPostsolveStack *)this_04);
      if (local_240 != (pointer)0x0) {
        operator_delete(local_240);
      }
      if (local_258 != (pointer)0x0) {
        operator_delete(local_258);
      }
      if ((pointer)local_270._M_allocated_capacity != (pointer)0x0) {
        operator_delete((void *)local_270._M_allocated_capacity);
      }
      if ((pointer)local_300._120_8_ != (pointer)0x0) {
        operator_delete((void *)local_300._120_8_);
      }
      if ((pointer)local_300._96_8_ != (pointer)0x0) {
        operator_delete((void *)local_300._96_8_);
      }
      if ((pointer)local_300._72_8_ != (pointer)0x0) {
        operator_delete((void *)local_300._72_8_);
      }
      if ((pointer)local_300._40_8_ != (pointer)0x0) {
        operator_delete((void *)local_300._40_8_);
      }
      (this->presolve_).presolve_status_ = presolve_status;
      HighsMipSolver::~HighsMipSolver((HighsMipSolver *)local_220);
    }
    else {
      PresolveComponent::init(this_00,(EVP_PKEY_CTX *)this_03);
      (this->presolve_).options_ = &this->options_;
      dVar4 = (this->options_).super_HighsOptionsStruct.time_limit;
      dVar15 = ABS(dVar4);
      bVar17 = (long)dVar15 - 1U < 0xfffffffffffff;
      bVar19 = (long)dVar4 < 0;
      bVar18 = dVar15 == 0.0;
      this_04 = (Highs *)CONCAT71(0xfffffffffff,bVar18);
      bVar16 = (uint)((long)dVar15 + 0xfff0000000000000U >> 0x35) < 0x3ff;
      if ((!bVar16 || !bVar19) &&
          ((dVar15 != INFINITY && (!bVar18 && 0x7fefffffffffffff >= (ulong)dVar15)) &&
          (!bVar17 || !bVar19))) {
        HighsTimer::read(this_02,0,&DAT_fff0000000000000,
                         CONCAT71((uint7)((long)dVar15 + 0xfff0000000000000U >> 0x3d),
                                  bVar16 && bVar19 ||
                                  ((dVar15 == INFINITY ||
                                   (bVar18 || 0x7fefffffffffffff < (ulong)dVar15)) ||
                                  bVar17 && bVar19)));
        if ((((this->presolve_).options_)->super_HighsOptionsStruct).time_limit -
            (extraout_XMM0_Qa_00 - extraout_XMM0_Qa) <= 0.0) {
          format = "Time limit reached while copying matrix into presolve.\n";
          goto LAB_0020825f;
        }
        this_04 = (Highs *)0x3;
        highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kVerbose,
                    "Time limit set: copying matrix took %.2g, presolve time left: %.2g\n");
      }
      presolve_status = PresolveComponent::run(this_00);
    }
    presolveStatusToString_abi_cxx11_((string *)local_220,this_04,presolve_status);
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kVerbose,
                "presolve_.run() returns status: %s\n",local_220._0_8_);
    if ((HighsCallback *)local_220._0_8_ != (HighsCallback *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_);
    }
    std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator=
              (&(this->presolve_log_).rule,&(this->presolve_).data_.presolve_log_.rule);
    HVar8 = (this->presolve_).presolve_status_;
    if (HVar8 == kReduced) {
      uVar2 = (this->model_).lp_.num_col_;
      uVar6 = (this->model_).lp_.num_row_;
      uVar3 = (this->presolve_).data_.reduced_lp_.num_col_;
      uVar7 = (this->presolve_).data_.reduced_lp_.num_row_;
      (this->presolve_).info_.n_rows_removed = uVar6 - uVar7;
      (this->presolve_).info_.n_cols_removed = uVar2 - uVar3;
      HVar12 = HighsSparseMatrix::numNz(this_01);
      HVar13 = HighsSparseMatrix::numNz(&(this->presolve_).data_.reduced_lp_.a_matrix_);
      (this->presolve_).info_.n_nnz_removed = HVar12 - HVar13;
      HighsLp::clearScale(&(this->presolve_).data_.reduced_lp_);
    }
    else if (HVar8 == kReducedToEmpty) {
      uVar1 = (this->model_).lp_.num_col_;
      uVar5 = (this->model_).lp_.num_row_;
      (this->presolve_).info_.n_rows_removed = uVar5;
      (this->presolve_).info_.n_cols_removed = uVar1;
      HVar12 = HighsSparseMatrix::numNz(this_01);
      (this->presolve_).info_.n_nnz_removed = HVar12;
    }
    bVar17 = HighsLp::isMip(&this_03->lp_);
    if ((!bVar17) &&
       (pHVar10 = (this->presolve_).data_.reduced_lp_.integrality_.
                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                  super__Vector_impl_data._M_start,
       *(pointer *)
        ((long)&(this->presolve_).data_.reduced_lp_.integrality_.
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data + 8) != pHVar10)) {
      *(pointer *)
       ((long)&(this->presolve_).data_.reduced_lp_.integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data + 8) = pHVar10;
    }
  }
  else {
    if (0.0 < dVar4 - extraout_XMM0_Qa) {
      highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kVerbose,
                  "Time limit set: reading matrix took %.2g, presolve time left: %.2g\n");
      goto LAB_00207f10;
    }
    format = "Time limit reached while reading in matrix\n";
LAB_0020825f:
    presolve_status = kTimeout;
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
  }
  return presolve_status;
}

Assistant:

HighsPresolveStatus Highs::runPresolve(const bool force_lp_presolve,
                                       const bool force_presolve) {
  presolve_.clear();
  // Exit if presolve is set to off (unless presolve is forced)
  if (options_.presolve == kHighsOffString && !force_presolve)
    return HighsPresolveStatus::kNotPresolved;

  if (model_.isEmpty()) {
    // Empty models shouldn't reach here, but this status would cause
    // no harm if one did
    assert(1 == 0);
    return HighsPresolveStatus::kNotReduced;
  }

  // Ensure that the LP is column-wise
  HighsLp& original_lp = model_.lp_;
  original_lp.ensureColwise();

  if (original_lp.num_col_ == 0 && original_lp.num_row_ == 0)
    return HighsPresolveStatus::kNullError;

  // Ensure that the timer is running
  if (!timer_.running()) timer_.start();
  double start_presolve = timer_.read();

  // Set time limit.
  if (options_.time_limit > 0 && options_.time_limit < kHighsInf) {
    double left = options_.time_limit - start_presolve;
    if (left <= 0) {
      highsLogDev(options_.log_options, HighsLogType::kError,
                  "Time limit reached while reading in matrix\n");
      return HighsPresolveStatus::kTimeout;
    }

    highsLogDev(options_.log_options, HighsLogType::kVerbose,
                "Time limit set: reading matrix took %.2g, presolve "
                "time left: %.2g\n",
                start_presolve, left);
  }

  // Presolve.
  HighsPresolveStatus presolve_return_status =
      HighsPresolveStatus::kNotPresolved;
  if (model_.isMip() && !force_lp_presolve) {
    // Use presolve for MIP
    //
    // Presolved model is extracted now since it's part of solver,
    // which is lost on return
    HighsMipSolver solver(callback_, options_, original_lp, solution_);
    // Start the MIP solver's timer so that timeout in presolve can be
    // identified
    solver.timer_.start();
    // Only place that HighsMipSolver::runPresolve is called
    solver.runPresolve(options_.presolve_reduction_limit);
    presolve_return_status = solver.getPresolveStatus();
    // Assign values to data members of presolve_
    presolve_.data_.reduced_lp_ = solver.getPresolvedModel();
    presolve_.data_.postSolveStack = solver.getPostsolveStack();
    presolve_.presolve_status_ = presolve_return_status;
    //    presolve_.data_.presolve_log_ =
  } else {
    // Use presolve for LP
    presolve_.init(original_lp, timer_);
    presolve_.options_ = &options_;
    if (options_.time_limit > 0 && options_.time_limit < kHighsInf) {
      double current = timer_.read();
      double time_init = current - start_presolve;
      double left = presolve_.options_->time_limit - time_init;
      if (left <= 0) {
        highsLogDev(options_.log_options, HighsLogType::kError,
                    "Time limit reached while copying matrix into presolve.\n");
        return HighsPresolveStatus::kTimeout;
      }
      highsLogDev(options_.log_options, HighsLogType::kVerbose,
                  "Time limit set: copying matrix took %.2g, presolve "
                  "time left: %.2g\n",
                  time_init, left);
    }

    presolve_return_status = presolve_.run();
  }

  highsLogDev(options_.log_options, HighsLogType::kVerbose,
              "presolve_.run() returns status: %s\n",
              presolveStatusToString(presolve_return_status).c_str());

  // Update reduction counts.
  assert(presolve_return_status == presolve_.presolve_status_);
  presolve_log_ = presolve_.getPresolveLog();
  switch (presolve_.presolve_status_) {
    case HighsPresolveStatus::kReduced: {
      HighsLp& reduced_lp = presolve_.getReducedProblem();
      presolve_.info_.n_cols_removed =
          original_lp.num_col_ - reduced_lp.num_col_;
      presolve_.info_.n_rows_removed =
          original_lp.num_row_ - reduced_lp.num_row_;
      presolve_.info_.n_nnz_removed = (HighsInt)original_lp.a_matrix_.numNz() -
                                      (HighsInt)reduced_lp.a_matrix_.numNz();
      // Clear any scaling information inherited by the reduced LP
      reduced_lp.clearScale();
      assert(lpDimensionsOk("RunPresolve: reduced_lp", reduced_lp,
                            options_.log_options));
      break;
    }
    case HighsPresolveStatus::kReducedToEmpty: {
      presolve_.info_.n_cols_removed = original_lp.num_col_;
      presolve_.info_.n_rows_removed = original_lp.num_row_;
      presolve_.info_.n_nnz_removed = (HighsInt)original_lp.a_matrix_.numNz();
      break;
    }
    default:
      break;
  }
  // Presolve creates integrality vector for an LP, so clear it
  if (!model_.isMip()) presolve_.data_.reduced_lp_.integrality_.clear();

  return presolve_return_status;
}